

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::ByteCodeWriter::TryWriteReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot R0,uint C1)

{
  bool bVar1;
  undefined1 local_14 [8];
  OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  
  if (((DAT_015b5fbd == '\0') && (R0 < 0x10000)) && (C1 < 0x10000)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_14,4);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteReg1Unsigned1(OpCode op, RegSlot R0, uint C1)
    {
        OpLayoutT_Reg1Unsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0) && SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }